

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcLShapeProfileDef::~IfcLShapeProfileDef(IfcLShapeProfileDef *this)

{
  IfcProfileDef::~IfcProfileDef((IfcProfileDef *)this,&PTR_construction_vtable_24__0075c290);
  return;
}

Assistant:

IfcLShapeProfileDef() : Object("IfcLShapeProfileDef") {}